

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::match(Parser *this,int t)

{
  int iVar1;
  ostream *poVar2;
  MismatchedTokenException *this_00;
  RefToken RStack_28;
  
  if (DEBUG_PARSER) {
    poVar2 = std::operator<<((ostream *)&std::cout,"enter match(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,t);
    poVar2 = std::operator<<(poVar2,") with LA(1)=");
    iVar1 = (*this->_vptr_Parser[4])(this,1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  iVar1 = (*this->_vptr_Parser[4])(this,1);
  if (iVar1 == t) {
    (*this->_vptr_Parser[2])(this);
    return;
  }
  if (DEBUG_PARSER == true) {
    poVar2 = std::operator<<((ostream *)&std::cout,"token mismatch: ");
    iVar1 = (*this->_vptr_Parser[4])(this,1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,"!=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,t);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  this_00 = (MismatchedTokenException *)__cxa_allocate_exception(0xb0);
  (*this->_vptr_Parser[5])(&RStack_28,this,1);
  MismatchedTokenException::MismatchedTokenException(this_00,&this->tokenNames,&RStack_28,t,false);
  __cxa_throw(this_00,&MismatchedTokenException::typeinfo,
              MismatchedTokenException::~MismatchedTokenException);
}

Assistant:

void Parser::match(int t)
{
	if ( DEBUG_PARSER )
		std::cout << "enter match(" << t << ") with LA(1)=" << LA(1) << std::endl;
	if ( LA(1)!=t ) {
		if ( DEBUG_PARSER )
			std::cout << "token mismatch: " << LA(1) << "!=" << t << std::endl;
		throw MismatchedTokenException(tokenNames, LT(1), t, false);
	} else {
		// mark token as consumed -- fetch next token deferred until LA/LT
		consume();
	}
}